

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O3

void routine2(void *arg)

{
  int line;
  int iVar1;
  int *__ptr;
  char *in_RCX;
  int in_EDX;
  int sock;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  int iVar3;
  
  line = test_socket_impl((char *)0x3e,0x51,in_EDX,(int)in_RCX);
  iVar3 = 10;
  uVar2 = extraout_RDX;
  do {
    test_connect_impl((char *)0x41,line,(int)uVar2,in_RCX);
    iVar3 = iVar3 + -1;
    uVar2 = extraout_RDX_00;
  } while (iVar3 != 0);
  iVar3 = 10;
  while( true ) {
    __ptr = (int *)malloc(6);
    if (__ptr == (int *)0x0) break;
    iVar1 = nn_recv(line,__ptr,6,0);
    if (iVar1 < 0) goto LAB_00101ae5;
    if (iVar1 != 5) goto LAB_00101aea;
    if ((char)__ptr[1] != 'o' || *__ptr != 0x6c6c6568) goto LAB_00101ae0;
    free(__ptr);
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      test_close_impl((char *)0x48,line,sock);
      active = active + -1;
      return;
    }
  }
  routine2_cold_4();
LAB_00101ae0:
  routine2_cold_2();
LAB_00101ae5:
  routine2_cold_3();
LAB_00101aea:
  routine2_cold_1();
}

Assistant:

static void routine2 (NN_UNUSED void *arg)
{
    int s;
    int i;

    s = test_socket (AF_SP, NN_PULL);

    for (i = 0; i < 10; ++i) {
        test_connect (s, SOCKET_ADDRESS);
    }

    for (i = 0; i < MESSAGES_PER_THREAD; ++i) {
        test_recv (s, "hello");
    }

    test_close (s);
    active --;
}